

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O2

qsizetype QtPrivate::count(QStringView haystack,QStringView needle,CaseSensitivity cs)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long in_FS_OFFSET;
  QStringMatcher matcher;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (haystack.m_size < 0x1f5 || needle.m_size < 6) {
    lVar2 = -1;
    lVar3 = lVar2;
    do {
      lVar2 = findString(haystack,lVar2 + 1,needle,cs);
      lVar3 = lVar3 + 1;
    } while (lVar2 != -1);
  }
  else {
    memset(&matcher,0xaa,0x138);
    QStringMatcher::QStringMatcher(&matcher,needle,cs);
    lVar2 = -1;
    lVar3 = lVar2;
    do {
      lVar2 = QStringMatcher::indexIn(&matcher,haystack,lVar2 + 1);
      lVar3 = lVar3 + 1;
    } while (lVar2 != -1);
    QStringMatcher::~QStringMatcher(&matcher);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return lVar3;
  }
  __stack_chk_fail();
}

Assistant:

qsizetype QtPrivate::count(QStringView haystack, QStringView needle, Qt::CaseSensitivity cs) noexcept
{
    qsizetype num = 0;
    qsizetype i = -1;
    if (haystack.size() > 500 && needle.size() > 5) {
        QStringMatcher matcher(needle, cs);
        while ((i = matcher.indexIn(haystack, i + 1)) != -1)
            ++num;
    } else {
        while ((i = QtPrivate::findString(haystack, i + 1, needle, cs)) != -1)
            ++num;
    }
    return num;
}